

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O1

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  pointer pcVar1;
  int in_ESI;
  
  *(undefined ***)this = &PTR__cmBasicUVStreambuf_00860e00;
  close(this,in_ESI);
  pcVar1 = (this->InputBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->InputBuffer).super__Vector_base<char,_std::allocator<char>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
  }
  *(code **)this = link;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::~cmBasicUVStreambuf()
{
  this->close();
}